

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

CRef __thiscall
Minisat::ClauseAllocator::alloc(ClauseAllocator *this,vec<Minisat::Lit,_int> *ps,bool learnt)

{
  bool use_extra;
  Ref r;
  Clause *this_00;
  
  use_extra = (bool)(this->extra_clause_field | learnt);
  r = RegionAllocator<unsigned_int>::alloc(&this->ra,ps->sz + (uint)use_extra + 1);
  this_00 = (Clause *)RegionAllocator<unsigned_int>::lea(&this->ra,r);
  Clause::Clause(this_00,ps,use_extra,learnt);
  return r;
}

Assistant:

CRef alloc(const vec<Lit>& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }